

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::InlinedVector
          (InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *this,
          InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *other)

{
  undefined8 *in_RSI;
  polymorphic_allocator<int> *in_RDI;
  int i;
  int local_14;
  
  in_RDI->memoryResource = (memory_resource *)*in_RSI;
  in_RDI[1].memoryResource = (memory_resource *)0x0;
  in_RDI[4].memoryResource = (memory_resource *)0x0;
  in_RDI[5].memoryResource = (memory_resource *)0x0;
  in_RDI[5].memoryResource = (memory_resource *)in_RSI[5];
  in_RDI[4].memoryResource = (memory_resource *)in_RSI[4];
  in_RDI[1].memoryResource = (memory_resource *)in_RSI[1];
  if ((ulong)in_RSI[5] < 5) {
    for (local_14 = 0; (ulong)(long)local_14 < (ulong)in_RSI[5]; local_14 = local_14 + 1) {
      pstd::pmr::polymorphic_allocator<int>::construct<int,int>
                (in_RDI,(int *)((long)&in_RDI[2].memoryResource + (long)local_14 * 4),
                 (int *)((long)in_RSI + (long)local_14 * 4 + 0x10));
    }
  }
  else {
    in_RSI[5] = 0;
  }
  in_RSI[4] = 0;
  in_RSI[1] = 0;
  return;
}

Assistant:

InlinedVector(InlinedVector &&other) : alloc(other.alloc) {
        nStored = other.nStored;
        nAlloc = other.nAlloc;
        ptr = other.ptr;
        if (other.nStored <= N)
            for (int i = 0; i < other.nStored; ++i)
                alloc.template construct<T>(fixed + i, std::move(other.fixed[i]));
        // Leave other.nStored as is, so that the detrius left after we
        // moved out of fixed has its destructors run...
        else
            other.nStored = 0;

        other.nAlloc = 0;
        other.ptr = nullptr;
    }